

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRTreeBuildVisitor.cpp
# Opt level: O0

IrtMapping * __thiscall
IRTreeBuildVisitor::GetTrees_abi_cxx11_(IrtMapping *__return_storage_ptr__,IRTreeBuildVisitor *this)

{
  IRTreeBuildVisitor *this_local;
  
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<IRT::Statement_*,_IRT::FrameTranslator_*>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<IRT::Statement_*,_IRT::FrameTranslator_*>_>_>_>
  ::unordered_map(__return_storage_ptr__,&this->method_trees_);
  return __return_storage_ptr__;
}

Assistant:

IrtMapping IRTreeBuildVisitor::GetTrees() { return method_trees_; }